

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

DOHcode skipqname(uchar *doh,size_t dohlen,uint *indexp)

{
  byte bVar1;
  uchar length;
  uint *indexp_local;
  size_t dohlen_local;
  uchar *doh_local;
  
  while( true ) {
    if (dohlen < *indexp + 1) {
      return DOH_DNS_OUT_OF_RANGE;
    }
    bVar1 = doh[*indexp];
    if ((bVar1 & 0xc0) == 0xc0) {
      if (*indexp + 2 <= dohlen) {
        *indexp = *indexp + 2;
        return DOH_OK;
      }
      return DOH_DNS_OUT_OF_RANGE;
    }
    if ((bVar1 & 0xc0) != 0) {
      return DOH_DNS_BAD_LABEL;
    }
    if (dohlen < *indexp + 1 + (uint)bVar1) break;
    *indexp = bVar1 + 1 + *indexp;
    if (bVar1 == 0) {
      return DOH_OK;
    }
  }
  return DOH_DNS_OUT_OF_RANGE;
}

Assistant:

static DOHcode skipqname(const unsigned char *doh, size_t dohlen,
                         unsigned int *indexp)
{
  unsigned char length;
  do {
    if(dohlen < (*indexp + 1))
      return DOH_DNS_OUT_OF_RANGE;
    length = doh[*indexp];
    if((length & 0xc0) == 0xc0) {
      /* name pointer, advance over it and be done */
      if(dohlen < (*indexp + 2))
        return DOH_DNS_OUT_OF_RANGE;
      *indexp += 2;
      break;
    }
    if(length & 0xc0)
      return DOH_DNS_BAD_LABEL;
    if(dohlen < (*indexp + 1 + length))
      return DOH_DNS_OUT_OF_RANGE;
    *indexp += 1 + length;
  } while(length);
  return DOH_OK;
}